

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O0

ostream * jsonnet::internal::operator<<(ostream *o,LocationRange *loc)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  string *in_RSI;
  ostream *in_RDI;
  Location *in_stack_ffffffffffffffe8;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::operator<<(in_RDI,in_RSI);
  }
  bVar1 = LocationRange::isSet((LocationRange *)0x230837);
  if (bVar1) {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 != 0) {
      std::operator<<(in_RDI,":");
    }
    if (*(long *)((ostream *)in_RSI + 0x20) == *(long *)((ostream *)in_RSI + 0x30)) {
      if (*(long *)((ostream *)in_RSI + 0x28) == *(long *)((ostream *)in_RSI + 0x38) + -1) {
        operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
      }
      else {
        poVar3 = operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
        poVar3 = std::operator<<(poVar3,"-");
        std::ostream::operator<<(poVar3,*(ulong *)((ostream *)in_RSI + 0x38));
      }
    }
    else {
      std::operator<<(in_RDI,"(");
      poVar3 = operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
      std::operator<<(poVar3,")-(");
      poVar3 = operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
      std::operator<<(poVar3,")");
    }
  }
  return in_RDI;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const LocationRange &loc)
{
    if (loc.file.length() > 0)
        o << loc.file;
    if (loc.isSet()) {
        if (loc.file.length() > 0)
            o << ":";
        if (loc.begin.line == loc.end.line) {
            if (loc.begin.column == loc.end.column - 1) {
                o << loc.begin;
            } else {
                o << loc.begin << "-" << loc.end.column;
            }
        } else {
            o << "(" << loc.begin << ")-(" << loc.end << ")";
        }
    }
    return o;
}